

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Transform *world_T_base,VectorDynSize *s,Twist *base_velocity,
          VectorDynSize *s_dot,Vector3 *world_gravity)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  FrameVelocityRepresentation FVar4;
  KinDynComputationsPrivateAttributes *pKVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  Index size;
  long lVar9;
  long lVar10;
  Transform *this_00;
  ulong uVar11;
  ulong uVar12;
  Twist *this_01;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  Rotation base_R_inertial;
  Rotation local_108 [48];
  Twist local_d8 [96];
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  lVar9 = iDynTree::VectorDynSize::size();
  lVar10 = iDynTree::Model::getNrOfPosCoords();
  if (lVar9 == lVar10) {
    lVar9 = iDynTree::VectorDynSize::size();
    lVar10 = iDynTree::Model::getNrOfDOFs();
    if (lVar9 == lVar10) {
      pKVar5 = this->pimpl;
      pKVar5->m_isFwdKinematicsUpdated = false;
      pKVar5->m_isRawMassMatrixUpdated = false;
      pKVar5->m_areBiasAccelerationsUpdated = false;
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::operator=(this_00,world_T_base);
      lVar9 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      iDynTree::FreeFloatingPos::jointPos();
      uVar11 = iDynTree::VectorDynSize::data();
      uVar12 = iDynTree::VectorDynSize::size();
      uVar13 = uVar12;
      if (((uVar11 & 7) == 0) &&
         (uVar13 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar13)) {
        uVar13 = uVar12;
      }
      lVar10 = uVar12 - uVar13;
      if (0 < (long)uVar13) {
        uVar15 = 0;
        do {
          *(undefined8 *)(uVar11 + uVar15 * 8) = *(undefined8 *)(lVar9 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      uVar15 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
      if (1 < lVar10) {
        do {
          puVar1 = (undefined8 *)(lVar9 + uVar13 * 8);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)(uVar11 + uVar13 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < (long)uVar15);
      }
      if ((long)uVar15 < (long)uVar12) {
        do {
          *(undefined8 *)(uVar11 + uVar15 * 8) = *(undefined8 *)(lVar9 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      pKVar5 = this->pimpl;
      (pKVar5->m_gravityAcc).m_data[2] = world_gravity->m_data[2];
      dVar3 = world_gravity->m_data[1];
      (pKVar5->m_gravityAcc).m_data[0] = world_gravity->m_data[0];
      (pKVar5->m_gravityAcc).m_data[1] = dVar3;
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      iDynTree::Rotation::inverse();
      pKVar5 = this->pimpl;
      dVar6 = (pKVar5->m_gravityAcc).m_data[0];
      dVar7 = (pKVar5->m_gravityAcc).m_data[1];
      dVar3 = (pKVar5->m_gravityAcc).m_data[2];
      (pKVar5->m_gravityAccInBaseLinkFrame).m_data[0] =
           local_68 * dVar3 + dStack_70 * dVar7 + local_78 * dVar6;
      (pKVar5->m_gravityAccInBaseLinkFrame).m_data[1] =
           local_50 * dVar3 + dStack_58 * dVar7 + dStack_60 * dVar6;
      (pKVar5->m_gravityAccInBaseLinkFrame).m_data[2] =
           dVar3 * local_38 + dVar7 * dStack_40 + dVar6 * local_48;
      lVar9 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      iDynTree::FreeFloatingVel::jointVel();
      uVar11 = iDynTree::VectorDynSize::data();
      uVar12 = iDynTree::VectorDynSize::size();
      uVar13 = uVar12;
      if (((uVar11 & 7) == 0) &&
         (uVar13 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar13)) {
        uVar13 = uVar12;
      }
      lVar10 = uVar12 - uVar13;
      if (0 < (long)uVar13) {
        uVar15 = 0;
        do {
          *(undefined8 *)(uVar11 + uVar15 * 8) = *(undefined8 *)(lVar9 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      uVar15 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar13;
      if (1 < lVar10) {
        do {
          puVar1 = (undefined8 *)(lVar9 + uVar13 * 8);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)(uVar11 + uVar13 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < (long)uVar15);
      }
      if ((long)uVar15 < (long)uVar12) {
        do {
          *(undefined8 *)(uVar11 + uVar15 * 8) = *(undefined8 *)(lVar9 + uVar15 * 8);
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      iDynTree::Twist::operator=(&this->pimpl->m_baseVelSetViaRobotState,base_velocity);
      FVar4 = this->pimpl->m_frameVelRepr;
      if (FVar4 == BODY_FIXED_REPRESENTATION) {
        this_01 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
      }
      else {
        if (FVar4 == MIXED_REPRESENTATION) {
          iDynTree::FreeFloatingPos::worldBasePos();
          iDynTree::Transform::getRotation();
          iDynTree::Rotation::inverse();
          iDynTree::Rotation::operator*(local_108,local_d8);
        }
        else {
          iDynTree::FreeFloatingPos::worldBasePos();
          iDynTree::Transform::inverse();
          iDynTree::Transform::operator*((Transform *)local_108,local_d8);
        }
        base_velocity = (Twist *)local_108;
        this_01 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
      }
      iDynTree::Twist::operator=(this_01,base_velocity);
      return true;
    }
    pcVar14 = "Wrong size in input joint velocities";
  }
  else {
    pcVar14 = "Wrong size in input joint positions";
  }
  iDynTree::reportError("KinDynComputations","setRobotState",pcVar14);
  return false;
}

Assistant:

bool KinDynComputations::setRobotState(const Transform& world_T_base,
                                       const VectorDynSize& s,
                                       const Twist& base_velocity,
                                       const VectorDynSize& s_dot,
                                       const Vector3& world_gravity)
{

    bool ok = s.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint positions");
        return false;
    }

    ok = s_dot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint velocities");
        return false;
    }

    this->invalidateCache();

    // Save pos
    this->pimpl->m_pos.worldBasePos() = world_T_base;
    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Save gravity
    this->pimpl->m_gravityAcc = world_gravity;
    Rotation base_R_inertial = this->pimpl->m_pos.worldBasePos().getRotation().inverse();
    toEigen(pimpl->m_gravityAccInBaseLinkFrame) = toEigen(base_R_inertial)*toEigen(this->pimpl->m_gravityAcc);

    // Save vel
    toEigen(pimpl->m_vel.jointVel()) = toEigen(s_dot);
    this->pimpl->m_baseVelSetViaRobotState = base_velocity;

    // Account for the different possible representations
    if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION)
    {
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().getRotation().inverse()*base_velocity;
    }
    else if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // Data is stored in body fixed
        pimpl->m_vel.baseVel() = base_velocity;
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        // base_X_inertial \ls^inertial v_base
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().inverse()*base_velocity;
    }

    return true;
}